

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-opengl.c
# Opt level: O1

int main(void)

{
  float *pfVar1;
  double dVar2;
  int iVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLint GVar7;
  GLFWwindow *handle;
  float *pfVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  undefined8 *puVar11;
  int r;
  long lVar12;
  float fVar13;
  undefined4 uVar14;
  float fVar15;
  int height;
  int width;
  GLuint vertex_array;
  mat4x4 p;
  GLuint vertex_buffer;
  mat4x4 temp;
  mat4x4 mvp;
  mat4x4 m;
  int local_174;
  int local_170;
  GLuint local_16c;
  float local_168;
  float local_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  ulong local_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  float fStack_138;
  undefined8 uStack_134;
  undefined4 local_12c;
  GLuint local_11c;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  float local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  glfwSetErrorCallback(error_callback);
  iVar3 = glfwInit();
  if (iVar3 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,3);
    glfwWindowHint(0x22008,0x32001);
    handle = glfwCreateWindow(0x280,0x1e0,"OpenGL Triangle",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(handle,key_callback);
      glfwMakeContextCurrent(handle);
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      (*glad_glGenBuffers)(1,&local_11c);
      (*glad_glBindBuffer)(0x8892,local_11c);
      (*glad_glBufferData)(0x8892,0x3c,vertices,0x88e4);
      GVar4 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar4,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar5,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar5);
      GVar6 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar6,GVar4);
      (*glad_glAttachShader)(GVar6,GVar5);
      (*glad_glLinkProgram)(GVar6);
      GVar7 = (*glad_glGetUniformLocation)(GVar6,"MVP");
      GVar4 = (*glad_glGetAttribLocation)(GVar6,"vPos");
      GVar5 = (*glad_glGetAttribLocation)(GVar6,"vCol");
      (*glad_glGenVertexArrays)(1,&local_16c);
      (*glad_glBindVertexArray)(local_16c);
      (*glad_glEnableVertexAttribArray)(GVar4);
      (*glad_glVertexAttribPointer)(GVar4,2,0x1406,'\0',0x14,(void *)0x0);
      (*glad_glEnableVertexAttribArray)(GVar5);
      (*glad_glVertexAttribPointer)(GVar5,3,0x1406,'\0',0x14,(void *)0x8);
      iVar3 = glfwWindowShouldClose(handle);
      if (iVar3 == 0) {
        do {
          glfwGetFramebufferSize(handle,&local_170,&local_174);
          iVar3 = local_170;
          fVar13 = (float)local_174;
          (*glad_glViewport)(0,0,local_170,local_174);
          (*glad_glClear)(0x4000);
          lVar9 = 0;
          puVar11 = &local_78;
          do {
            lVar10 = 0;
            do {
              uVar14 = 0x3f800000;
              if (lVar9 != lVar10) {
                uVar14 = 0;
              }
              *(undefined4 *)((long)puVar11 + lVar10 * 4) = uVar14;
              lVar10 = lVar10 + 1;
            } while (lVar10 != 4);
            lVar9 = lVar9 + 1;
            puVar11 = puVar11 + 2;
          } while (lVar9 != 4);
          local_c8 = ZEXT416((uint)(float)iVar3);
          dVar2 = glfwGetTime();
          local_d8 = sinf((float)dVar2);
          local_168 = cosf((float)dVar2);
          local_164 = local_d8;
          uStack_160 = 0;
          uStack_15c = 0;
          local_158 = CONCAT44(local_168,local_d8) ^ 0x80000000;
          uStack_150 = 0;
          uStack_148 = 0;
          local_140 = 0x3f800000;
          uStack_13c = 0;
          fStack_138 = 0.0;
          uStack_134 = 0;
          local_12c = 0x3f800000;
          lVar9 = 0;
          pfVar8 = &local_168;
          do {
            lVar10 = 0;
            puVar11 = &local_78;
            do {
              pfVar1 = (float *)((long)&local_118 + lVar10 * 4 + lVar9 * 0x10);
              *pfVar1 = 0.0;
              fVar15 = 0.0;
              lVar12 = 0;
              do {
                fVar15 = fVar15 + *(float *)((long)puVar11 + lVar12 * 4) *
                                  *(float *)((long)pfVar8 + lVar12);
                lVar12 = lVar12 + 4;
              } while (lVar12 != 0x10);
              *pfVar1 = fVar15;
              lVar10 = lVar10 + 1;
              puVar11 = (undefined8 *)((long)puVar11 + 4);
            } while (lVar10 != 4);
            lVar9 = lVar9 + 1;
            pfVar8 = pfVar8 + 4;
          } while (lVar9 != 4);
          fVar13 = (float)local_c8._0_4_ / fVar13;
          local_48 = local_e8;
          uStack_40 = uStack_e0;
          local_58 = local_f8;
          uStack_50 = uStack_f0;
          local_68 = local_108;
          uStack_60 = uStack_100;
          local_78 = local_118;
          uStack_70 = uStack_110;
          local_168 = 2.0 / (fVar13 + fVar13);
          uStack_15c = 0;
          local_164 = 0.0;
          uStack_160 = 0;
          local_158 = 0x3f80000000000000;
          uStack_150 = 0;
          local_140 = 0x3f800000;
          uStack_13c = 0;
          uStack_148 = 0;
          fStack_138 = -(fVar13 - fVar13) / (fVar13 + fVar13);
          uStack_134 = 0x80000000;
          local_12c = 0x3f800000;
          lVar9 = 0;
          puVar11 = &local_78;
          do {
            lVar10 = 0;
            pfVar8 = &local_168;
            do {
              pfVar1 = (float *)((long)&local_118 + lVar10 * 4 + lVar9 * 0x10);
              *pfVar1 = 0.0;
              fVar13 = 0.0;
              lVar12 = 0;
              do {
                fVar13 = fVar13 + pfVar8[lVar12] * *(float *)((long)puVar11 + lVar12);
                lVar12 = lVar12 + 4;
              } while (lVar12 != 0x10);
              *pfVar1 = fVar13;
              lVar10 = lVar10 + 1;
              pfVar8 = pfVar8 + 1;
            } while (lVar10 != 4);
            lVar9 = lVar9 + 1;
            puVar11 = puVar11 + 2;
          } while (lVar9 != 4);
          local_88 = local_e8;
          uStack_80 = uStack_e0;
          local_98 = local_f8;
          uStack_90 = uStack_f0;
          local_a8 = local_108;
          uStack_a0 = uStack_100;
          local_b8 = local_118;
          uStack_b0 = uStack_110;
          (*glad_glUseProgram)(GVar6);
          (*glad_glUniformMatrix4fv)(GVar7,1,'\0',(GLfloat *)&local_b8);
          (*glad_glBindVertexArray)(local_16c);
          (*glad_glDrawArrays)(4,0,3);
          glfwSwapBuffers(handle);
          glfwPollEvents();
          iVar3 = glfwWindowShouldClose(handle);
        } while (iVar3 == 0);
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 3);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);

    GLFWwindow* window = glfwCreateWindow(640, 480, "OpenGL Triangle", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    // NOTE: OpenGL error checks have been omitted for brevity

    GLuint vertex_buffer;
    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    const GLuint vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    const GLuint fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    const GLuint program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    const GLint mvp_location = glGetUniformLocation(program, "MVP");
    const GLint vpos_location = glGetAttribLocation(program, "vPos");
    const GLint vcol_location = glGetAttribLocation(program, "vCol");

    GLuint vertex_array;
    glGenVertexArrays(1, &vertex_array);
    glBindVertexArray(vertex_array);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, pos));
    glEnableVertexAttribArray(vcol_location);
    glVertexAttribPointer(vcol_location, 3, GL_FLOAT, GL_FALSE,
                          sizeof(Vertex), (void*) offsetof(Vertex, col));

    while (!glfwWindowShouldClose(window))
    {
        int width, height;
        glfwGetFramebufferSize(window, &width, &height);
        const float ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4 m, p, mvp;
        mat4x4_identity(m);
        mat4x4_rotate_Z(m, m, (float) glfwGetTime());
        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) &mvp);
        glBindVertexArray(vertex_array);
        glDrawArrays(GL_TRIANGLES, 0, 3);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}